

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O0

vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
* google::protobuf::compiler::cpp::ParseFunctionGenerator::BuildFieldOptions
            (vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             *__return_storage_ptr__,Descriptor *descriptor,
            Span<const_google::protobuf::FieldDescriptor_*const> ordered_fields,Options *options,
            MessageSCCAnalyzer *scc_analyzer,Span<const_int> has_bit_indices,
            Span<const_int> inlined_string_indices)

{
  int v1;
  uint v2;
  size_type sVar1;
  FieldDescriptor *pFVar2;
  reference ppFVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  reference piVar6;
  size_type sVar7;
  int __c;
  int __c_00;
  FieldDescriptor *pFVar8;
  int local_184;
  int local_11c;
  _Optional_payload_base<float> local_b0;
  value_type local_a8;
  size_type local_88;
  size_t index;
  Voidify local_69;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldDescriptor *field;
  size_t i;
  undefined1 local_39;
  MessageSCCAnalyzer *local_38;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  Descriptor *descriptor_local;
  Span<const_google::protobuf::FieldDescriptor_*const> ordered_fields_local;
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  *fields;
  
  ordered_fields_local.ptr_ = (pointer)ordered_fields.len_;
  descriptor_local = (Descriptor *)ordered_fields.ptr_;
  local_39 = 0;
  local_38 = scc_analyzer;
  scc_analyzer_local = (MessageSCCAnalyzer *)options;
  options_local = (Options *)descriptor;
  ordered_fields_local.len_ = (size_type)__return_storage_ptr__;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::vector(__return_storage_ptr__);
  sVar1 = absl::lts_20250127::Span<const_google::protobuf::FieldDescriptor_*const>::size
                    ((Span<const_google::protobuf::FieldDescriptor_*const> *)&descriptor_local);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::reserve(__return_storage_ptr__,sVar1);
  field = (FieldDescriptor *)0x0;
  while( true ) {
    pFVar8 = field;
    pFVar2 = (FieldDescriptor *)
             absl::lts_20250127::Span<const_google::protobuf::FieldDescriptor_*const>::size
                       ((Span<const_google::protobuf::FieldDescriptor_*const> *)&descriptor_local);
    if (pFVar2 <= pFVar8) {
      return __return_storage_ptr__;
    }
    pFVar8 = field;
    ppFVar3 = absl::lts_20250127::Span<const_google::protobuf::FieldDescriptor_*const>::operator[]
                        ((Span<const_google::protobuf::FieldDescriptor_*const> *)&descriptor_local,
                         (size_type)field);
    absl_log_internal_check_op_result = (Nullable<const_char_*>)*ppFVar3;
    pcVar4 = FieldDescriptor::index
                       ((FieldDescriptor *)absl_log_internal_check_op_result,(char *)pFVar8,__c);
    v1 = absl::lts_20250127::log_internal::GetReferenceableValue((int)pcVar4);
    v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
    pcVar4 = (char *)(ulong)v2;
    local_68 = absl::lts_20250127::log_internal::Check_GEImpl(v1,v2,"field->index() >= 0");
    if (local_68 != (Nullable<const_char_*>)0x0) break;
    pcVar4 = FieldDescriptor::index
                       ((FieldDescriptor *)absl_log_internal_check_op_result,pcVar4,__c_00);
    local_a8.field = (FieldDescriptor *)absl_log_internal_check_op_result;
    local_88 = (long)(int)pcVar4;
    sVar1 = absl::lts_20250127::Span<const_int>::size(&has_bit_indices);
    if ((ulong)(long)(int)pcVar4 < sVar1) {
      piVar6 = absl::lts_20250127::Span<const_int>::operator[](&has_bit_indices,local_88);
      local_11c = *piVar6;
    }
    else {
      local_11c = -1;
    }
    local_a8.has_bit_index = local_11c;
    local_b0 = (_Optional_payload_base<float>)
               GetPresenceProbability
                         ((FieldDescriptor *)absl_log_internal_check_op_result,
                          (Options *)scc_analyzer_local);
    local_a8.presence_probability =
         std::optional<float>::value_or<float_const&>
                   ((optional<float> *)&local_b0,&kUnknownPresenceProbability);
    local_a8.lazy_opt =
         GetLazyStyle((FieldDescriptor *)absl_log_internal_check_op_result,
                      (Options *)scc_analyzer_local,local_38);
    local_a8.is_string_inlined =
         IsStringInlined((FieldDescriptor *)absl_log_internal_check_op_result,
                         (Options *)scc_analyzer_local);
    local_a8.is_implicitly_weak =
         IsImplicitWeakField((FieldDescriptor *)absl_log_internal_check_op_result,
                             (Options *)scc_analyzer_local,local_38);
    local_a8.use_direct_tcparser_table = true;
    local_a8.should_split =
         ShouldSplit((FieldDescriptor *)absl_log_internal_check_op_result,
                     (Options *)scc_analyzer_local);
    sVar1 = local_88;
    sVar7 = absl::lts_20250127::Span<const_int>::size(&inlined_string_indices);
    if (sVar1 < sVar7) {
      piVar6 = absl::lts_20250127::Span<const_int>::operator[](&inlined_string_indices,local_88);
      local_184 = *piVar6;
    }
    else {
      local_184 = -1;
    }
    local_a8.inlined_string_index = local_184;
    local_a8.use_micro_string =
         IsMicroString((FieldDescriptor *)absl_log_internal_check_op_result,
                       (Options *)scc_analyzer_local);
    std::
    vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
    ::push_back(__return_storage_ptr__,&local_a8);
    field = (FieldDescriptor *)&field->field_0x1;
  }
  pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_68);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&index,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/parse_function_generator.cc"
             ,0x59,pcVar4);
  pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&index);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar5);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&index);
}

Assistant:

std::vector<internal::TailCallTableInfo::FieldOptions>
ParseFunctionGenerator::BuildFieldOptions(
    const Descriptor* descriptor,
    absl::Span<const FieldDescriptor* const> ordered_fields,
    const Options& options, MessageSCCAnalyzer* scc_analyzer,
    absl::Span<const int> has_bit_indices,
    absl::Span<const int> inlined_string_indices) {
  std::vector<TailCallTableInfo::FieldOptions> fields;
  fields.reserve(ordered_fields.size());
  for (size_t i = 0; i < ordered_fields.size(); ++i) {
    auto* field = ordered_fields[i];
    ABSL_CHECK_GE(field->index(), 0);
    size_t index = static_cast<size_t>(field->index());
    fields.push_back({
        field,
        index < has_bit_indices.size() ? has_bit_indices[index] : -1,
        GetPresenceProbability(field, options)
            .value_or(kUnknownPresenceProbability),
        GetLazyStyle(field, options, scc_analyzer),
        IsStringInlined(field, options),
        IsImplicitWeakField(field, options, scc_analyzer),
        /* use_direct_tcparser_table */ true,
        ShouldSplit(field, options),
        index < inlined_string_indices.size() ? inlined_string_indices[index]
                                              : -1,
        IsMicroString(field, options),
    });
  }
  return fields;
}